

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_include_date(archive *_a,wchar_t flag,char *datestr)

{
  undefined8 in_RDX;
  wchar_t flag_00;
  undefined4 in_ESI;
  wchar_t r;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  flag_00 = (wchar_t)((ulong)in_RDX >> 0x20);
  local_4 = validate_time_flag((archive *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),flag_00,
                               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                              );
  if (local_4 == L'\0') {
    local_4 = set_timefilter_date((archive_match *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                  flag_00,(char *)(ulong)in_stack_ffffffffffffffd8);
  }
  return local_4;
}

Assistant:

int
archive_match_include_date(struct archive *_a, int flag,
    const char *datestr)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_date");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter_date((struct archive_match *)_a, flag, datestr);
}